

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffmcrd(fitsfile *fptr,char *keyname,char *card,int *status)

{
  FITSfile *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  size_t sVar4;
  char value [81];
  char valstring [81];
  char tcard [81];
  char nextcomm [73];
  char comm [81];
  undefined8 uStack_200;
  char local_1f8 [96];
  char local_198 [96];
  char local_138 [96];
  char local_d8 [80];
  char local_88 [96];
  
  if (0 < *status) {
    return *status;
  }
  uStack_200 = 0x1a3437;
  iVar3 = ffgcrd(fptr,keyname,local_138,status);
  if (iVar3 < 1) {
    uStack_200 = 0x1a344d;
    ffmkey(fptr,card,status);
    pFVar1 = fptr->Fptr;
    auVar2 = SEXT816(pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    uStack_200 = 0x1a3491;
    ffpsvc(local_138,local_198,local_88,status);
    if (0 < *status) {
      return *status;
    }
    uStack_200 = 0x1a34ac;
    ffpmrk();
    uStack_200 = 0x1a34bc;
    ffc2s(local_198,local_1f8,status);
    if (*status == 0xcc) {
      uStack_200 = 0x1a34c9;
      ffcmrk();
      *status = 0;
    }
    else {
      uStack_200 = 0x1a34df;
      sVar4 = strlen(local_1f8);
      if ((int)sVar4 != 0) {
        do {
          if (local_1f8[(long)(int)sVar4 + -1] != '&') break;
          uStack_200 = 0x1a351f;
          ffgcnt(fptr,local_1f8,local_d8,status);
          if (local_1f8[0] == '\0') {
            sVar4 = 0;
          }
          else {
            uStack_200 = 0x1a3532;
            ffdrec(fptr,((int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f)) + 1,status);
            uStack_200 = 0x1a353a;
            sVar4 = strlen(local_1f8);
          }
        } while ((int)sVar4 != 0);
      }
    }
  }
  return *status;
}

Assistant:

int ffmcrd(fitsfile *fptr,      /* I - FITS file pointer  */
           const char *keyname, /* I - keyword name       */
           const char *card,    /* I - card string value  */
           int *status)         /* IO - error status      */
{
    char tcard[FLEN_CARD], valstring[FLEN_CARD], comm[FLEN_CARD], value[FLEN_CARD];
    char nextcomm[FLEN_COMMENT];
    int keypos, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgcrd(fptr, keyname, tcard, status) > 0)
        return(*status);

    ffmkey(fptr, card, status);

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1;

    ffpsvc(tcard, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}